

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QList<int> * __thiscall
QAccessibleTable::selectedRows(QList<int> *__return_storage_ptr__,QAccessibleTable *this)

{
  QModelIndex *pQVar1;
  QAbstractItemView *pQVar2;
  QItemSelectionModel *pQVar3;
  QModelIndexList *__range1;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QAbstractItemView *)view(this);
  pQVar3 = QAbstractItemView::selectionModel(pQVar2);
  if (pQVar3 == (QItemSelectionModel *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QAbstractItemView *)view(this);
    QAbstractItemView::selectionModel(pQVar2);
    QItemSelectionModel::selectedRows((int)&local_48);
    QList<int>::reserve(__return_storage_ptr__,local_48.size);
    pQVar1 = local_48.ptr;
    lVar5 = local_48.size * 0x18;
    for (lVar4 = 0; lVar5 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      QList<int>::append(__return_storage_ptr__,*(parameter_type *)((long)&pQVar1->r + lVar4));
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QAccessibleTable::selectedRows() const
{
    if (!view()->selectionModel())
        return QList<int>();
    QList<int> rows;
    const QModelIndexList selectedRows = view()->selectionModel()->selectedRows();
    rows.reserve(selectedRows.size());
    for (const QModelIndex &index : selectedRows)
        rows.append(index.row());

    return rows;
}